

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_decoder.cpp
# Opt level: O0

String * __thiscall
LLVMBC::BlockOrRecord::getString_abi_cxx11_
          (String *__return_storage_ptr__,BlockOrRecord *this,size_t startOffset)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong local_40;
  size_t i;
  size_t startOffset_local;
  BlockOrRecord *this_local;
  String *ret;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(__return_storage_ptr__);
  sVar2 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                    (&this->ops);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  resize(__return_storage_ptr__,sVar2 - startOffset);
  for (local_40 = 0;
      sVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              size(__return_storage_ptr__), local_40 < sVar3; local_40 = local_40 + 1) {
    pvVar4 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::operator[]
                       (&this->ops,local_40 + startOffset);
    vVar1 = *pvVar4;
    pvVar5 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
             operator[](__return_storage_ptr__,local_40);
    *pvVar5 = (value_type)vVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

dxil_spv::String BlockOrRecord::getString(size_t startOffset) const
{
  dxil_spv::String ret;
  ret.resize(ops.size() - startOffset);
  for(size_t i = 0; i < ret.size(); i++)
    ret[i] = (char)ops[i + startOffset];
  return ret;
}